

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Abc_NtkFinCountPairs(Vec_Wec_t *vClasses)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int i;
  
  iVar2 = 0;
  for (i = 0; i < vClasses->nSize; i = i + 1) {
    pVVar1 = Vec_WecEntry(vClasses,i);
    iVar2 = iVar2 + pVVar1->nSize + -1;
  }
  return iVar2;
}

Assistant:

int Abc_NtkFinCountPairs( Vec_Wec_t * vClasses )
{
    int i, Counter = 0;
    Vec_Int_t * vLevel;
    Vec_WecForEachLevel( vClasses, vLevel, i )
        Counter += Vec_IntSize(vLevel) - 1;
    return Counter;
}